

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O1

Gia_Man_t *
Bmc_GiaGenerateGiaOne(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Bit_t **pvInits,int iFrBeg,int iFrEnd)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  char *__s;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  Vec_Bit_t *pVVar7;
  int *__s_00;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *__dest;
  Gia_Obj_t *pGVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  Vec_Bit_t *vValues;
  Vec_Bit_t *vJustis;
  int local_5c;
  Vec_Bit_t *local_50;
  int local_44;
  Vec_Bit_t *local_40;
  Vec_Bit_t *local_38;
  
  local_44 = iFrEnd;
  Bmc_GiaGenerateJust(p,pCex,&local_50,&local_40);
  iVar12 = ((p->nRegs >> 5) + 1) - (uint)((p->nRegs & 0x1fU) == 0);
  pVVar7 = (Vec_Bit_t *)malloc(0x10);
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar12 * 0x20;
  if (iVar12 == 0) {
    __s_00 = (int *)0x0;
  }
  else {
    __s_00 = (int *)malloc((long)iVar12 * 4);
  }
  pVVar7->pArray = __s_00;
  pVVar7->nSize = iVar12 * 0x20;
  uVar13 = 0;
  memset(__s_00,0,(long)iVar12 << 2);
  *pvInits = pVVar7;
  uVar11 = p->nRegs;
  if (0 < (int)uVar11) {
    pVVar2 = p->vCis;
    do {
      iVar12 = pVVar2->nSize;
      uVar10 = (uVar13 - uVar11) + iVar12;
      if (((int)uVar10 < 0) || (iVar12 <= (int)uVar10)) goto LAB_004fa2d0;
      iVar12 = pVVar2->pArray[uVar10];
      if ((iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_004fa2b1;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar10 = p->nObjs * iFrBeg + iVar12;
      if (((int)uVar10 < 0) || (local_50->nSize <= (int)uVar10)) goto LAB_004fa292;
      if (((uint)local_50->pArray[uVar10 >> 5] >> (uVar10 & 0x1f) & 1) != 0) {
        if (pVVar7->nSize <= (int)uVar13) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecBit.h"
                        ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
        }
        __s_00[uVar13 >> 5] = __s_00[uVar13 >> 5] | 1 << ((byte)uVar13 & 0x1f);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar11);
  }
  p_00 = Gia_ManStart(uVar11 * 2 + 2);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar8 = strlen(__s);
    __dest = (char *)malloc(sVar8 + 1);
    strcpy(__dest,__s);
  }
  pVVar7 = local_40;
  p_00->pName = __dest;
  iVar12 = p->nRegs;
  if (iVar12 < 1) {
    local_5c = 1;
  }
  else {
    iVar14 = 0;
    local_5c = 1;
    local_38 = local_50;
    do {
      iVar1 = p->vCis->nSize;
      uVar11 = (iVar1 - iVar12) + iVar14;
      if (((int)uVar11 < 0) || (iVar1 <= (int)uVar11)) {
LAB_004fa2d0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar12 = p->vCis->pArray[uVar11];
      if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) {
LAB_004fa2b1:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar4 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar5 = p_00->pObjs;
      if ((pGVar9 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar9)) {
LAB_004fa273:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar9 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar9)) goto LAB_004fa273;
      pGVar3 = pGVar3 + iVar12;
      pGVar6 = p->pObjs;
      if ((pGVar3 < pGVar6) || (pGVar6 + p->nObjs <= pGVar3)) goto LAB_004fa273;
      uVar11 = (int)((ulong)((long)pGVar3 - (long)pGVar6) >> 2) * -0x55555555 + p->nObjs * local_44;
      if (((int)uVar11 < 0) || (pVVar7->nSize <= (int)uVar11)) goto LAB_004fa292;
      if (((uint)pVVar7->pArray[uVar11 >> 5] >> (uVar11 & 0x1f) & 1) != 0) {
        if (local_38->nSize <= (int)uVar11) {
LAB_004fa292:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        uVar13 = (int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * 0x55555556;
        if (((uint)local_38->pArray[uVar11 >> 5] >> (uVar11 & 0x1f) & 1) == 0) {
          if ((int)uVar13 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10e,"int Abc_LitNot(int)");
          }
          uVar13 = uVar13 | 1;
        }
        local_5c = Gia_ManAppendAnd(p_00,local_5c,uVar13);
      }
      iVar14 = iVar14 + 1;
      iVar12 = p->nRegs;
    } while (iVar14 < iVar12);
  }
  Gia_ManAppendCo(p_00,local_5c);
  if (local_50->pArray != (int *)0x0) {
    free(local_50->pArray);
    local_50->pArray = (int *)0x0;
  }
  if (local_50 != (Vec_Bit_t *)0x0) {
    free(local_50);
  }
  if (local_40->pArray != (int *)0x0) {
    free(local_40->pArray);
    local_40->pArray = (int *)0x0;
  }
  if (local_40 != (Vec_Bit_t *)0x0) {
    free(local_40);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Bmc_GiaGenerateGiaOne( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Bit_t ** pvInits, int iFrBeg, int iFrEnd )
{
    Vec_Bit_t * vValues;
    Vec_Bit_t * vJustis;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int k, Cube = 1, Counter = 0;
    Bmc_GiaGenerateJust( p, pCex, &vValues, &vJustis );
    // collect flop values in frame iFrBeg
    *pvInits = Vec_BitStart( Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObj, k )
        if ( Vec_BitEntry(vValues, Gia_ManObjNum(p) * iFrBeg + Gia_ObjId(p, pObj)) )
            Vec_BitWriteEntry( *pvInits, k, 1 );
    // create GIA with justified values in iFrEnd
    pNew = Gia_ManStart( 2 * Gia_ManRegNum(p) + 2 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManForEachRo( p, pObj, k )
    {
        int Literal = Gia_ManAppendCi(pNew);
        if ( !Vec_BitEntry(vJustis, Gia_ManObjNum(p) * iFrEnd + Gia_ObjId(p, pObj)) )
            continue;
        if ( Vec_BitEntry(vValues, Gia_ManObjNum(p) * iFrEnd + Gia_ObjId(p, pObj)) )
            Cube = Gia_ManAppendAnd( pNew, Cube, Literal );
        else
            Cube = Gia_ManAppendAnd( pNew, Cube, Abc_LitNot(Literal) );
        Counter++;
    }
//    printf( "Only %d flops (out of %d) belong to the care set.\n", Counter, Gia_ManRegNum(p) );
    Gia_ManAppendCo( pNew, Cube );
    Vec_BitFree( vValues );
    Vec_BitFree( vJustis );
    return pNew;
}